

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *
anon_unknown.dwarf_baaa9c::computeImplicitLanguageTargets<cmLinkImplItem>
          (vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__return_storage_ptr__,
          string *lang,string *config,cmGeneratorTarget *currentTarget)

{
  cmMakefile *this;
  string_view arg;
  bool bVar1;
  string *this_00;
  size_type __n;
  cmLinkImplItem local_1a0;
  undefined1 local_158 [8];
  TargetOrString resolved;
  string *i;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libsVec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  cmValue local_88;
  cmValue runtimeLinkOptions;
  string local_70;
  string *local_50;
  string *runtimeLibrary;
  cmLocalGenerator *lg;
  undefined1 local_38 [8];
  cmListFileBacktrace bt;
  cmGeneratorTarget *currentTarget_local;
  string *config_local;
  string *lang_local;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *result;
  
  bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currentTarget;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_38);
  lg._7_1_ = 0;
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::vector(__return_storage_ptr__);
  runtimeLibrary =
       (string *)
       cmGeneratorTarget::GetLocalGenerator
                 ((cmGeneratorTarget *)
                  bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi);
  cmGeneratorTarget::GetRuntimeLinkLibrary
            (&local_70,
             (cmGeneratorTarget *)
             bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,lang,config);
  local_50 = &local_70;
  this = *(cmMakefile **)
          &(bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &libsVec.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"CMAKE_",lang);
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &libsVec.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"_RUNTIME_LIBRARIES_");
  std::operator+(&local_a8,&local_c8,local_50);
  local_88 = cmMakefile::GetDefinition(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string
            ((string *)
             &libsVec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = cmValue::operator_cast_to_bool(&local_88);
  if (bVar1) {
    this_00 = cmValue::operator*[abi_cxx11_(&local_88);
    arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_100,arg,false);
    __n = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100);
    std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::reserve
              (__return_storage_ptr__,__n);
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_100);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar1) {
      resolved.Target =
           (cmGeneratorTarget *)
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end3);
      cmGeneratorTarget::ResolveTargetReference
                ((TargetOrString *)local_158,
                 (cmGeneratorTarget *)
                 bt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi,(string *)resolved.Target,(cmLocalGenerator *)runtimeLibrary);
      if (resolved.String.field_2._8_8_ != 0) {
        constructItem<cmLinkImplItem>
                  (&local_1a0,(cmGeneratorTarget *)resolved.String.field_2._8_8_,
                   (cmListFileBacktrace *)local_38);
        std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::emplace_back<cmLinkImplItem>
                  (__return_storage_ptr__,&local_1a0);
        cmLinkImplItem::~cmLinkImplItem(&local_1a0);
      }
      cmGeneratorTarget::TargetOrString::~TargetOrString((TargetOrString *)local_158);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100);
  }
  lg._7_1_ = 1;
  std::__cxx11::string::~string((string *)&local_70);
  if ((lg._7_1_ & 1) == 0) {
    std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector(__return_storage_ptr__);
  }
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ValueType> computeImplicitLanguageTargets(
  std::string const& lang, std::string const& config,
  cmGeneratorTarget const* currentTarget)
{
  cmListFileBacktrace bt;
  std::vector<ValueType> result;
  cmLocalGenerator* lg = currentTarget->GetLocalGenerator();

  std::string const& runtimeLibrary =
    currentTarget->GetRuntimeLinkLibrary(lang, config);
  if (cmValue runtimeLinkOptions = currentTarget->Makefile->GetDefinition(
        "CMAKE_" + lang + "_RUNTIME_LIBRARIES_" + runtimeLibrary)) {
    std::vector<std::string> libsVec = cmExpandedList(*runtimeLinkOptions);
    result.reserve(libsVec.size());

    for (std::string const& i : libsVec) {
      cmGeneratorTarget::TargetOrString resolved =
        currentTarget->ResolveTargetReference(i, lg);
      if (resolved.Target) {
        result.emplace_back(constructItem<ValueType>(resolved.Target, bt));
      }
    }
  }

  return result;
}